

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# S2Test.cpp
# Opt level: O0

void __thiscall RandomS2IsInM::test_method(RandomS2IsInM *this)

{
  undefined8 uVar1;
  byte bVar2;
  bool bVar3;
  lazy_ostream *plVar4;
  Index size;
  basic_cstring<const_char> local_2e8;
  basic_cstring<const_char> local_2d8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_2c8;
  assertion_result local_2a8;
  basic_cstring<const_char> local_290;
  basic_cstring<const_char> local_280;
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>> local_270 [24];
  RandomReturnType local_258;
  basic_cstring<const_char> local_248;
  basic_cstring<const_char> local_238;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_228;
  assertion_result local_208;
  basic_cstring<const_char> local_1f0;
  basic_cstring<const_char> local_1e0 [2];
  Point local_1c0 [8];
  Point y;
  S2 local_98 [8];
  S2 S;
  RandomS2IsInM *this_local;
  
  mnf::S2::S2(local_98);
  mnf::Manifold::createRandomPoint(1.0);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (local_1e0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/S2Test.cpp"
               ,0x67);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1f0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,local_1e0,0x4e,&local_1f0);
    bVar2 = mnf::Point::isInM(1e-12);
    boost::test_tools::assertion_result::assertion_result(&local_208,(bool)(bVar2 & 1));
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_238,"y.isInM()",9);
    boost::unit_test::operator<<(&local_228,plVar4,&local_238);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_248,
               "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/S2Test.cpp"
               ,0x67);
    boost::test_tools::tt_detail::report_assertion(&local_208,&local_228,&local_248,0x4e,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_228);
    boost::test_tools::assertion_result::~assertion_result(&local_208);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  size = mnf::Manifold::representationDim();
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Random(&local_258,size);
  mnf::SubPoint::value();
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>::operator=
            (local_270,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&local_258);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_280,
               "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/S2Test.cpp"
               ,0x67);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_290);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_280,0x50,&local_290);
    bVar2 = mnf::Point::isInM(1e-12);
    boost::test_tools::assertion_result::assertion_result(&local_2a8,(bool)(~bVar2 & 1));
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2d8,"!y.isInM()",10);
    boost::unit_test::operator<<(&local_2c8,plVar4,&local_2d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2e8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/S2Test.cpp"
               ,0x67);
    boost::test_tools::tt_detail::report_assertion(&local_2a8,&local_2c8,&local_2e8,0x50,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_2c8);
    boost::test_tools::assertion_result::~assertion_result(&local_2a8);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  mnf::Point::~Point(local_1c0);
  mnf::S2::~S2(local_98);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(RandomS2IsInM)
{
  S2 S;
  Point y = S.createRandomPoint();
  BOOST_CHECK(y.isInM());
  y.value() = Eigen::VectorXd::Random(S.representationDim());
  BOOST_CHECK(!y.isInM());
}